

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseElementName(Parser *this,QString *name)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  TokenType TVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  TVar5 = lookup(this);
  if (TVar5 == IDENT) {
    lexem((QString *)&local_38,this);
    pDVar2 = (name->d).d;
    pcVar3 = (name->d).ptr;
    (name->d).d = local_38.d;
    (name->d).ptr = local_38.ptr;
    qVar1 = (name->d).size;
    (name->d).size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  else {
    if (TVar5 != STAR) {
      bVar4 = false;
      goto LAB_00546ac6;
    }
    QString::clear(name);
  }
  bVar4 = true;
LAB_00546ac6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseElementName(QString *name)
{
    switch (lookup()) {
        case STAR: name->clear(); break;
        case IDENT: *name = lexem(); break;
        default: return false;
    }
    return true;
}